

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.h
# Opt level: O0

void __thiscall MutableS2ShapeIndex::MaybeApplyUpdates(MutableS2ShapeIndex *this)

{
  IndexStatus IVar1;
  MutableS2ShapeIndex *this_local;
  
  IVar1 = std::atomic<MutableS2ShapeIndex::IndexStatus>::load
                    (&this->index_status_,memory_order_acquire);
  if (IVar1 != FRESH) {
    ApplyUpdatesThreadSafe(this);
  }
  return;
}

Assistant:

inline void MutableS2ShapeIndex::MaybeApplyUpdates() const {
  // To avoid acquiring and releasing the spinlock on every query, we use
  // atomic operations when testing whether the status is FRESH and when
  // updating the status to be FRESH.  This guarantees that any thread that
  // sees a status of FRESH will also see the corresponding index updates.
  if (index_status_.load(std::memory_order_acquire) != FRESH) {
    const_cast<MutableS2ShapeIndex*>(this)->ApplyUpdatesThreadSafe();
  }
}